

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPUUtilizationContainer.cpp
# Opt level: O0

void __thiscall GPUUtilizationContainer::GPUUtilizationContainer(GPUUtilizationContainer *this)

{
  int iVar1;
  UtilizationWidget *this_00;
  FlowGridLayout *pFVar2;
  GPUUtDetailsWidget *this_01;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  GPUUtilizationContainer *local_10;
  GPUUtilizationContainer *this_local;
  
  local_10 = this;
  UtilizationContainer::UtilizationContainer(&this->super_UtilizationContainer);
  *(undefined ***)&this->super_UtilizationContainer = &PTR_metaObject_00141570;
  *(undefined ***)&(this->super_UtilizationContainer).field_0x10 =
       &PTR__GPUUtilizationContainer_00141720;
  this_00 = (UtilizationWidget *)operator_new(0x2868);
  GPUUtilizationWidget::GPUUtilizationWidget
            ((GPUUtilizationWidget *)this_00,&this->super_UtilizationContainer);
  (this->super_UtilizationContainer).utilizationWidget = this_00;
  QString::QString((QString *)local_38,"GPU Utilization");
  UtilizationContainer::build(&this->super_UtilizationContainer,(QString *)local_38);
  QString::~QString((QString *)local_38);
  local_3c = 0;
  while( true ) {
    iVar1 = InfoProvider::getGPUCount();
    if (iVar1 <= local_3c) break;
    pFVar2 = UtilizationContainer::getDescLayout(&this->super_UtilizationContainer);
    this_01 = (GPUUtDetailsWidget *)operator_new(0x28);
    GPUUtDetailsWidget::GPUUtDetailsWidget(this_01,&this->super_UtilizationContainer,local_3c);
    QLayout::addWidget((QWidget *)pFVar2);
    local_3c = local_3c + 1;
  }
  UtilizationContainer::updateLegend(&this->super_UtilizationContainer);
  return;
}

Assistant:

GPUUtilizationContainer::GPUUtilizationContainer() {
    utilizationWidget = new GPUUtilizationWidget(this);
    build("GPU Utilization");

    for (int i = 0; i < InfoProvider::getGPUCount(); i++)
        getDescLayout()->addWidget(new GPUUtDetailsWidget(this, i));

    updateLegend();
}